

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpdtrans.cpp
# Opt level: O2

void __thiscall
icu_63::CompoundTransliterator::CompoundTransliterator
          (CompoundTransliterator *this,UVector *list,UParseError *param_2,UErrorCode *status)

{
  UnicodeString local_58;
  
  local_58.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  local_58.fUnion.fStackFields.fLengthAndFlags = 2;
  Transliterator::Transliterator(&this->super_Transliterator,&local_58,(UnicodeFilter *)0x0);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  (this->super_Transliterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CompoundTransliterator_004607c0;
  this->trans = (Transliterator **)0x0;
  this->numAnonymousRBTs = 0;
  init(this,(EVP_PKEY_CTX *)list);
  return;
}

Assistant:

CompoundTransliterator::CompoundTransliterator(UVector& list,
                                               UParseError& /*parseError*/,
                                               UErrorCode& status) :
    Transliterator(UnicodeString(), NULL),
    trans(0), numAnonymousRBTs(0)
{
    // TODO add code for parseError...currently unused, but
    // later may be used by parsing code...
    init(list, UTRANS_FORWARD, FALSE, status);
    // assume caller will fixup ID
}